

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

void __thiscall slang::parsing::Preprocessor::pushSource(Preprocessor *this,SourceBuffer buffer)

{
  std::
  make_unique<slang::parsing::Lexer,slang::SourceBuffer&,slang::BumpAllocator&,slang::Diagnostics&,slang::SourceManager&,slang::parsing::LexerOptions&>
            ((SourceBuffer *)&stack0xffffffffffffffe8,(BumpAllocator *)&buffer,
             (Diagnostics *)this->alloc,(SourceManager *)this->diagnostics,
             (LexerOptions *)this->sourceManager);
  SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>>
  ::emplace_back<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>>
            ((SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>>
              *)&this->lexerStack,
             (unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_> *)
             &stack0xffffffffffffffe8);
  std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>::~unique_ptr
            ((unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_> *)
             &stack0xffffffffffffffe8);
  return;
}

Assistant:

void Preprocessor::pushSource(SourceBuffer buffer) {
    SLANG_ASSERT(buffer.id);

    lexerStack.emplace_back(
        std::make_unique<Lexer>(buffer, alloc, diagnostics, sourceManager, lexerOptions));
}